

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::LowestFloorAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  subsector_t *psVar1;
  double x;
  double y;
  double dVar2;
  
  x = p->X;
  y = p->Y;
  if ((this->planes[0].Flags & 0x1d0U) == 0x100) {
    dVar2 = 3.4028234663852886e+38;
    do {
      if (dVar2 < sectorPortals.Array[this->Portals[0]].mPlaneZ ||
          dVar2 == sectorPortals.Array[this->Portals[0]].mPlaneZ) break;
      x = x + sectorPortals.Array[this->Portals[0]].mDisplacement.X;
      y = y + sectorPortals.Array[this->Portals[0]].mDisplacement.Y;
      dVar2 = sectorPortals.Array[this->Portals[1]].mPlaneZ;
      psVar1 = P_PointInSubsector(x,y);
      this = psVar1->sector;
    } while ((this->planes[0].Flags & 0x1d0U) == 0x100);
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = this;
  }
  return (y * (this->floorplane).normal.Y + (this->floorplane).D + x * (this->floorplane).normal.X)
         * (this->floorplane).negiC;
}

Assistant:

double sector_t::LowestFloorAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal above where we actually are.
	while (!check->PortalBlocksMovement(floor) && planeheight > check->GetPortalPlaneZ(floor))
	{
		pos += check->GetPortalDisplacement(floor);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->floorplane.ZatPoint(pos);
}